

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O1

void __thiscall
IfNeuron::IfNeuron(IfNeuron *this,Time *time,double v_0,double theta,double spikeheight,double tau,
                  double v_rest,string *name,string *type)

{
  StochasticEventGenerator *this_00;
  pointer pcVar1;
  Time *time_00;
  VoltageDependance *this_01;
  StochasticVariable *integrator;
  undefined1 local_300 [104];
  DifferentialEquation *local_298;
  StochasticEventGenerator *local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  long *local_160 [2];
  long local_150 [2];
  string local_140;
  string local_120;
  undefined1 local_100 [104];
  Unit local_98;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_288 = tau;
  local_280 = v_rest;
  local_278 = spikeheight;
  local_270 = theta;
  local_268 = v_0;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (type->_M_dataplus)._M_p;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar1,pcVar1 + type->_M_string_length);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_120,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron = (_func_int **)&PTR_addStimulus_0015d0f0;
  this_00 = &(this->super_SpikingNeuron).super_StochasticEventGenerator;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric = (_func_int **)&PTR__IfNeuron_0015d158;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__IfNeuron_0015d1f0;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__IfNeuron_0015d238;
  local_300._0_8_ = local_300 + 0x10;
  local_290 = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"V","");
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Differential Equation","");
  local_298 = &this->ifneuronMembrane;
  DifferentialEquation::DifferentialEquation
            (local_298,time,local_268,0.0,(string *)local_300,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  local_300._0_8_ = local_300 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"threshold","");
  Parametric::addParameter((Parametric *)this_00,(string *)local_300);
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  local_300._0_8_ = local_300 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"spike-height","");
  Parametric::addParameter((Parametric *)this_00,(string *)local_300);
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  local_300._0_8_ = local_300 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"membrane","");
  Parametric::addParameter((Parametric *)this_00,(string *)local_300);
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.
                     physicalDescription,0,
             (char *)(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.
                     physicalDescription._M_string_length,0x14d87f);
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"LIF neuron membrane","");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
              stochDescription);
  if (local_160[0] != local_150) {
    operator_delete(local_160[0],local_150[0] + 1);
  }
  this->ifneuronSpikeHeight = local_278;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventCurrentValue = false;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
  this->ifneuronTheta = local_270;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"m","");
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"V","");
  Unit::Unit((Unit *)local_300,&local_180,&local_1a0);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"u","");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"F","");
  Unit::Unit((Unit *)local_100,&local_1c0,&local_1e0);
  operator*(&local_98,(Unit *)local_300,(Unit *)local_100);
  Physical::setUnit(&(this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                     super_Physical,&local_98);
  Unit::~Unit(&local_98);
  Unit::~Unit((Unit *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  Unit::~Unit((Unit *)local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"m","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"V","");
  Unit::Unit((Unit *)local_300,&local_200,&local_220);
  Unit::operator=(&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                   super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit,
                  (Unit *)local_300);
  Unit::~Unit((Unit *)local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  this_01 = (VoltageDependance *)operator_new(0x160);
  local_300._0_8_ = local_300 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"leak","");
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Weighted Difference","");
  VoltageDependance::VoltageDependance
            (this_01,1.0 / local_288,local_280,(string *)local_300,(string *)local_100);
  integrator = (StochasticVariable *)operator_new(0x148);
  time_00 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
            super_StochasticProcess.super_TimeDependent.xTime;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"t","");
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Time Process","");
  TimeProcess::TimeProcess((TimeProcess *)integrator,time_00,&local_240,&local_260);
  DifferentialEquation::addTerm(local_298,(StochasticFunction *)this_01,integrator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  return;
}

Assistant:

IfNeuron::IfNeuron(Time *time, double v_0, double theta, double spikeheight, double tau, double v_rest, const string& name, const string& type)
	: SpikingNeuron(time, name, type), ifneuronMembrane(time, v_0, 0.0, "V")
{
	// parameter accessors
	addParameter("threshold");
	addParameter("spike-height");
	addParameter("membrane");
	
	// write descriptions
	physicalDescription = "voltage";
	ifneuronMembrane.setDescription("LIF neuron membrane");
	
	// assign values
	ifneuronSpikeHeight = spikeheight;
	eventCurrentValue = false;
	eventNextValue = false;
	ifneuronTheta = theta;	
	ifneuronMembrane.setUnit( Unit("m","V") * Unit("u","F") );
	physicalUnit = Unit("m","V");
	
	// add decay terms
	ifneuronMembrane.addTerm( new VoltageDependance(1.0/tau, v_rest, "leak"), new TimeProcess(xTime) );
}